

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_subscribe_notifications(cubeb_conflict *context,pa_subscription_mask_t mask)

{
  pa_operation *o;
  int iVar1;
  
  (*cubeb_pa_threaded_mainloop_lock)(context->mainloop);
  (*cubeb_pa_context_set_subscribe_callback)(context->context,pulse_subscribe_callback,context);
  o = (*cubeb_pa_context_subscribe)(context->context,mask,subscribe_success,context);
  if (o == (pa_operation *)0x0) {
    (*cubeb_pa_threaded_mainloop_unlock)(context->mainloop);
    iVar1 = -1;
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
       (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
      (*g_cubeb_log_callback)("%s:%d: Context subscribe failed\n","cubeb_pulse.c",0x624);
    }
  }
  else {
    iVar1 = 0;
    operation_wait(context,(pa_stream *)0x0,o);
    (*cubeb_pa_operation_unref)(o);
    (*cubeb_pa_threaded_mainloop_unlock)(context->mainloop);
  }
  return iVar1;
}

Assistant:

static int
pulse_subscribe_notifications(cubeb * context, pa_subscription_mask_t mask) {
  WRAP(pa_threaded_mainloop_lock)(context->mainloop);

  WRAP(pa_context_set_subscribe_callback)(context->context, pulse_subscribe_callback, context);

  pa_operation * o;
  o = WRAP(pa_context_subscribe)(context->context, mask, subscribe_success, context);
  if (o == NULL) {
    WRAP(pa_threaded_mainloop_unlock)(context->mainloop);
    LOG("Context subscribe failed");
    return CUBEB_ERROR;
  }
  operation_wait(context, NULL, o);
  WRAP(pa_operation_unref)(o);

  WRAP(pa_threaded_mainloop_unlock)(context->mainloop);

  return CUBEB_OK;
}